

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlStaticCopyNode(xmlNodePtr node,xmlDocPtr doc,xmlNodePtr parent,int extended)

{
  xmlElementType xVar1;
  xmlNodePtr pxVar2;
  int iVar3;
  xmlNs *in_RAX;
  xmlNodePtr pxVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlNsPtr pxVar7;
  xmlAttrPtr pxVar8;
  xmlEntityPtr pxVar9;
  xmlDocPtr pxVar10;
  xmlNodePtr pxVar11;
  xmlRegisterNodeFunc *pp_Var12;
  xmlNs *pxVar13;
  _xmlNode **pp_Var14;
  _xmlNode *p_Var15;
  int iVar16;
  xmlNodePtr parent_00;
  xmlNodePtr pxVar17;
  xmlNsPtr ns;
  xmlNsPtr local_38;
  
  if (node == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  switch(node->type) {
  case XML_ELEMENT_NODE:
  case XML_TEXT_NODE:
  case XML_CDATA_SECTION_NODE:
  case XML_ENTITY_REF_NODE:
  case XML_PI_NODE:
  case XML_COMMENT_NODE:
  case XML_DOCUMENT_FRAG_NODE:
  case XML_XINCLUDE_START:
  case XML_XINCLUDE_END:
    break;
  case XML_ATTRIBUTE_NODE:
    pxVar4 = (xmlNodePtr)xmlCopyPropInternal(doc,parent,(xmlAttrPtr)node);
    return pxVar4;
  default:
    return (xmlNodePtr)0x0;
  case XML_DOCUMENT_NODE:
  case XML_HTML_DOCUMENT_NODE:
    pxVar10 = xmlCopyDoc((xmlDocPtr)node,extended);
    return (xmlNodePtr)pxVar10;
  case XML_NAMESPACE_DECL:
    pxVar4 = (xmlNodePtr)xmlCopyNamespaceList((xmlNsPtr)node);
    return pxVar4;
  }
  local_38 = in_RAX;
  pxVar4 = (xmlNodePtr)(*xmlMalloc)(0x78);
  if (pxVar4 == (xmlNodePtr)0x0) {
    return (xmlNodePtr)0x0;
  }
  pxVar4->nsDef = (xmlNs *)0x0;
  pxVar4->psvi = (void *)0x0;
  pxVar4->content = (xmlChar *)0x0;
  pxVar4->properties = (_xmlAttr *)0x0;
  pxVar4->doc = (_xmlDoc *)0x0;
  pxVar4->ns = (xmlNs *)0x0;
  pxVar4->next = (_xmlNode *)0x0;
  pxVar4->prev = (_xmlNode *)0x0;
  pxVar4->last = (_xmlNode *)0x0;
  pxVar4->parent = (_xmlNode *)0x0;
  pxVar4->name = (xmlChar *)0x0;
  pxVar4->children = (_xmlNode *)0x0;
  pxVar4->_private = (void *)0x0;
  *(undefined8 *)&pxVar4->type = 0;
  pxVar4->line = 0;
  pxVar4->extra = 0;
  *(undefined4 *)&pxVar4->field_0x74 = 0;
  pxVar4->type = node->type;
  pxVar4->doc = doc;
  pxVar4->parent = parent;
  pxVar6 = node->name;
  pxVar5 = "text";
  if (((pxVar6 == "text") || (pxVar5 = "textnoenc", pxVar6 == "textnoenc")) ||
     (pxVar5 = "comment", pxVar6 == "comment")) {
    pxVar4->name = pxVar5;
  }
  else if (pxVar6 != (xmlChar *)0x0) {
    if ((doc == (xmlDocPtr)0x0) || (doc->dict == (xmlDictPtr)0x0)) {
      pxVar6 = xmlStrdup(pxVar6);
    }
    else {
      pxVar6 = xmlDictLookup(doc->dict,pxVar6,-1);
    }
    pxVar4->name = pxVar6;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0014c966;
  }
  xVar1 = node->type;
  if (xVar1 == XML_ELEMENT_NODE) {
LAB_0014c757:
    pxVar4->line = node->line;
  }
  else if ((node->content == (xmlChar *)0x0) ||
          ((xVar1 < (XML_XINCLUDE_END|XML_ELEMENT_NODE) &&
           ((0x180020U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)))) {
    if (xVar1 == XML_ELEMENT_NODE) goto LAB_0014c757;
  }
  else {
    pxVar6 = xmlStrdup(node->content);
    pxVar4->content = pxVar6;
    if (pxVar6 == (xmlChar *)0x0) goto LAB_0014c966;
  }
  if (extended == 0) goto LAB_0014c98e;
  if (((node->type == XML_XINCLUDE_START) || (node->type == XML_ELEMENT_NODE)) &&
     (node->nsDef != (xmlNsPtr)0x0)) {
    pxVar7 = xmlCopyNamespaceList(node->nsDef);
    pxVar4->nsDef = pxVar7;
    if (pxVar7 == (xmlNsPtr)0x0) goto LAB_0014c966;
  }
  if ((node->type == XML_ELEMENT_NODE) && (node->ns != (xmlNs *)0x0)) {
    local_38 = (xmlNs *)0x0;
    iVar3 = xmlSearchNsSafe(pxVar4,node->ns->prefix,&local_38);
    iVar16 = 3;
    if (-1 < iVar3) {
      if (local_38 == (xmlNs *)0x0) {
        iVar3 = xmlSearchNsSafe(node,node->ns->prefix,&local_38);
        if (-1 < iVar3) {
          p_Var15 = pxVar4;
          if (local_38 == (xmlNs *)0x0) {
            pxVar13 = xmlNewReconciledNs(pxVar4,node->ns);
          }
          else {
            do {
              pxVar17 = p_Var15;
              p_Var15 = pxVar17->parent;
            } while (p_Var15 != (_xmlNode *)0x0);
            pxVar13 = xmlNewNs(pxVar17,local_38->href,local_38->prefix);
          }
          pxVar4->ns = pxVar13;
          if (pxVar13 != (xmlNs *)0x0) goto LAB_0014c7d2;
        }
      }
      else {
        pxVar4->ns = local_38;
LAB_0014c7d2:
        iVar16 = 0;
      }
    }
    if (iVar16 == 3) goto LAB_0014c966;
    if (iVar16 != 0) {
      return pxVar4;
    }
  }
  if ((node->type == XML_ELEMENT_NODE) && (node->properties != (xmlAttrPtr)0x0)) {
    pxVar8 = xmlCopyPropList(pxVar4,node->properties);
    pxVar4->properties = pxVar8;
    if (pxVar8 == (xmlAttrPtr)0x0) goto LAB_0014c966;
  }
  if (node->type == XML_ENTITY_REF_NODE) {
    if ((doc == (xmlDocPtr)0x0) || (node->doc != doc)) {
      pxVar9 = xmlGetDocEntity(doc,pxVar4->name);
    }
    else {
      pxVar9 = (xmlEntityPtr)node->children;
    }
    pxVar4->children = (_xmlNode *)pxVar9;
    pxVar4->last = (_xmlNode *)pxVar9;
  }
  else {
    pxVar17 = node->children;
    parent_00 = pxVar4;
    if (extended != 2 && pxVar17 != (_xmlNode *)0x0) {
      do {
        pxVar11 = xmlStaticCopyNode(pxVar17,doc,parent_00,2);
        if (pxVar11 == (xmlNodePtr)0x0) {
          iVar3 = 3;
          pxVar11 = parent_00;
          p_Var15 = pxVar17;
        }
        else {
          pxVar2 = parent_00->last;
          if (pxVar2 != pxVar11) {
            if (pxVar2 == (xmlNodePtr)0x0) {
              pp_Var14 = &parent_00->children;
            }
            else {
              pxVar11->prev = pxVar2;
              pp_Var14 = &pxVar2->next;
            }
            *pp_Var14 = pxVar11;
            parent_00->last = pxVar11;
          }
          if (pxVar17->type != XML_ENTITY_REF_NODE) {
            iVar3 = 7;
            p_Var15 = pxVar17->children;
            if (pxVar17->children != (_xmlNode *)0x0) goto LAB_0014c918;
          }
          do {
            if (pxVar17->next != (_xmlNode *)0x0) {
              iVar3 = 0;
              pxVar11 = parent_00;
              p_Var15 = pxVar17->next;
              goto LAB_0014c918;
            }
            pxVar17 = pxVar17->parent;
            parent_00 = parent_00->parent;
          } while (pxVar17 != node);
          iVar3 = 0;
          pxVar11 = parent_00;
          p_Var15 = (_xmlNode *)0x0;
        }
LAB_0014c918:
        if ((iVar3 != 7) && (iVar3 != 0)) goto LAB_0014c932;
        parent_00 = pxVar11;
        pxVar17 = p_Var15;
      } while (p_Var15 != (_xmlNode *)0x0);
      iVar3 = 0;
LAB_0014c932:
      if (iVar3 == 3) {
LAB_0014c966:
        xmlFreeNode(pxVar4);
        return (xmlNodePtr)0x0;
      }
      if (iVar3 != 0) {
        return pxVar4;
      }
    }
  }
LAB_0014c98e:
  if (xmlRegisterCallbacks == 0) {
    return pxVar4;
  }
  pp_Var12 = __xmlRegisterNodeDefaultValue();
  if (*pp_Var12 == (xmlRegisterNodeFunc)0x0) {
    return pxVar4;
  }
  pp_Var12 = __xmlRegisterNodeDefaultValue();
  (**pp_Var12)(pxVar4);
  return pxVar4;
}

Assistant:

xmlNodePtr
xmlStaticCopyNode(xmlNodePtr node, xmlDocPtr doc, xmlNodePtr parent,
                  int extended) {
    xmlNodePtr ret;

    if (node == NULL) return(NULL);
    switch (node->type) {
        case XML_TEXT_NODE:
        case XML_CDATA_SECTION_NODE:
        case XML_ELEMENT_NODE:
        case XML_DOCUMENT_FRAG_NODE:
        case XML_ENTITY_REF_NODE:
        case XML_PI_NODE:
        case XML_COMMENT_NODE:
        case XML_XINCLUDE_START:
        case XML_XINCLUDE_END:
	    break;
        case XML_ATTRIBUTE_NODE:
		return((xmlNodePtr) xmlCopyPropInternal(doc, parent, (xmlAttrPtr) node));
        case XML_NAMESPACE_DECL:
	    return((xmlNodePtr) xmlCopyNamespaceList((xmlNsPtr) node));

        case XML_DOCUMENT_NODE:
        case XML_HTML_DOCUMENT_NODE:
	    return((xmlNodePtr) xmlCopyDoc((xmlDocPtr) node, extended));
        default:
            return(NULL);
    }

    /*
     * Allocate a new node and fill the fields.
     */
    ret = (xmlNodePtr) xmlMalloc(sizeof(xmlNode));
    if (ret == NULL)
	return(NULL);
    memset(ret, 0, sizeof(xmlNode));
    ret->type = node->type;

    ret->doc = doc;
    ret->parent = parent;
    if (node->name == xmlStringText)
	ret->name = xmlStringText;
    else if (node->name == xmlStringTextNoenc)
	ret->name = xmlStringTextNoenc;
    else if (node->name == xmlStringComment)
	ret->name = xmlStringComment;
    else if (node->name != NULL) {
        if ((doc != NULL) && (doc->dict != NULL))
	    ret->name = xmlDictLookup(doc->dict, node->name, -1);
	else
	    ret->name = xmlStrdup(node->name);
        if (ret->name == NULL)
            goto error;
    }
    if ((node->type != XML_ELEMENT_NODE) &&
	(node->content != NULL) &&
	(node->type != XML_ENTITY_REF_NODE) &&
	(node->type != XML_XINCLUDE_END) &&
	(node->type != XML_XINCLUDE_START)) {
	ret->content = xmlStrdup(node->content);
        if (ret->content == NULL)
            goto error;
    }else{
      if (node->type == XML_ELEMENT_NODE)
        ret->line = node->line;
    }

    if (!extended)
	goto out;
    if (((node->type == XML_ELEMENT_NODE) ||
         (node->type == XML_XINCLUDE_START)) && (node->nsDef != NULL)) {
        ret->nsDef = xmlCopyNamespaceList(node->nsDef);
        if (ret->nsDef == NULL)
            goto error;
    }

    if ((node->type == XML_ELEMENT_NODE) && (node->ns != NULL)) {
        xmlNsPtr ns = NULL;
        int res;

	res = xmlSearchNsSafe(ret, node->ns->prefix, &ns);
        if (res < 0)
            goto error;
	if (ns == NULL) {
	    /*
	     * Humm, we are copying an element whose namespace is defined
	     * out of the new tree scope. Search it in the original tree
	     * and add it at the top of the new tree.
             *
             * TODO: Searching the original tree seems unnecessary. We
             * already have a namespace URI.
	     */
	    res = xmlSearchNsSafe(node, node->ns->prefix, &ns);
            if (res < 0)
                goto error;
	    if (ns != NULL) {
	        xmlNodePtr root = ret;

		while (root->parent != NULL) root = root->parent;
		ret->ns = xmlNewNs(root, ns->href, ns->prefix);
            } else {
                ret->ns = xmlNewReconciledNs(ret, node->ns);
	    }
            if (ret->ns == NULL)
                goto error;
	} else {
	    /*
	     * reference the existing namespace definition in our own tree.
	     */
	    ret->ns = ns;
	}
    }
    if ((node->type == XML_ELEMENT_NODE) && (node->properties != NULL)) {
        ret->properties = xmlCopyPropList(ret, node->properties);
        if (ret->properties == NULL)
            goto error;
    }
    if (node->type == XML_ENTITY_REF_NODE) {
	if ((doc == NULL) || (node->doc != doc)) {
	    /*
	     * The copied node will go into a separate document, so
	     * to avoid dangling references to the ENTITY_DECL node
	     * we cannot keep the reference. Try to find it in the
	     * target document.
	     */
	    ret->children = (xmlNodePtr) xmlGetDocEntity(doc, ret->name);
	} else {
            ret->children = node->children;
	}
	ret->last = ret->children;
    } else if ((node->children != NULL) && (extended != 2)) {
        xmlNodePtr cur, insert;

        cur = node->children;
        insert = ret;
        while (cur != NULL) {
            xmlNodePtr copy = xmlStaticCopyNode(cur, doc, insert, 2);
            if (copy == NULL)
                goto error;

            /* Check for coalesced text nodes */
            if (insert->last != copy) {
                if (insert->last == NULL) {
                    insert->children = copy;
                } else {
                    copy->prev = insert->last;
                    insert->last->next = copy;
                }
                insert->last = copy;
            }

            if ((cur->type != XML_ENTITY_REF_NODE) &&
                (cur->children != NULL)) {
                cur = cur->children;
                insert = copy;
                continue;
            }

            while (1) {
                if (cur->next != NULL) {
                    cur = cur->next;
                    break;
                }

                cur = cur->parent;
                insert = insert->parent;
                if (cur == node) {
                    cur = NULL;
                    break;
                }
            }
        }
    }

out:
    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
	xmlRegisterNodeDefaultValue((xmlNodePtr)ret);
    return(ret);

error:
    xmlFreeNode(ret);
    return(NULL);
}